

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3127fc::Handlers::beginAddAttachment(Handlers *this,JSON *param_1)

{
  shared_ptr<QPDFJob::AttConfig> local_28;
  JSON *local_18;
  JSON *param_1_local;
  Handlers *this_local;
  
  local_18 = param_1;
  param_1_local = (JSON *)this;
  std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->c_main);
  QPDFJob::Config::addAttachment((Config *)&local_28);
  std::shared_ptr<QPDFJob::AttConfig>::operator=(&this->c_att,&local_28);
  std::shared_ptr<QPDFJob::AttConfig>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
Handlers::beginAddAttachment(JSON)
{
    this->c_att = c_main->addAttachment();
}